

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

void check_ly_eq_lyc(Emulator *e,Bool write)

{
  u8 uVar1;
  byte bVar2;
  PPUMode PVar3;
  Bool BVar4;
  
  uVar1 = (e->state).ppu.lyc;
  if ((e->state).ppu.ly == uVar1) {
LAB_0010dbc3:
    (e->state).ppu.stat.y_compare.trigger = TRUE;
    (e->state).ppu.stat.new_ly_eq_lyc = TRUE;
    return;
  }
  if (write == FALSE) {
    (e->state).ppu.stat.y_compare.trigger = FALSE;
    (e->state).ppu.stat.new_ly_eq_lyc = FALSE;
    (e->state).ppu.stat.ly_eq_lyc = FALSE;
    return;
  }
  if ((uVar1 == 0x99) && ((e->state).ppu.last_ly == 0x99)) goto LAB_0010dbc3;
  (e->state).ppu.stat.y_compare.trigger = FALSE;
  (e->state).ppu.stat.new_ly_eq_lyc = FALSE;
  (e->state).ppu.stat.ly_eq_lyc = FALSE;
  if (write == FALSE) {
    return;
  }
  bVar2 = (e->state).interrupt.new_if;
  if ((~(e->state).interrupt.if_ & bVar2 & 2) == 0) {
    return;
  }
  PVar3 = (e->state).ppu.stat.trigger_mode;
  if (PVar3 == PPU_MODE_VBLANK) {
    BVar4 = (e->state).ppu.stat.vblank.irq;
  }
  else {
    if (PVar3 != PPU_MODE_HBLANK) goto LAB_0010dc3d;
    BVar4 = (e->state).ppu.stat.hblank.irq;
  }
  if (BVar4 != FALSE) {
    return;
  }
LAB_0010dc3d:
  if (((e->state).ppu.stat.mode2.trigger != FALSE) && ((e->state).ppu.stat.mode2.irq != FALSE)) {
    return;
  }
  (e->state).interrupt.new_if = bVar2 & 0xfd;
  return;
}

Assistant:

static void check_ly_eq_lyc(Emulator* e, Bool write) {
  if (PPU.ly == PPU.lyc ||
      (write && PPU.last_ly == SCREEN_HEIGHT_WITH_VBLANK - 1 &&
       PPU.last_ly == PPU.lyc)) {
    HOOK(trigger_y_compare_ii, PPU.ly, TICKS + CPU_TICK);
    STAT.y_compare.trigger = TRUE;
    STAT.new_ly_eq_lyc = TRUE;
  } else {
    STAT.y_compare.trigger = FALSE;
    STAT.ly_eq_lyc = STAT.new_ly_eq_lyc = FALSE;
    if (write) {
      /* If stat was triggered this frame due to Y compare, cancel it.
       * There's probably a nicer way to do this. */
      if ((INTR.new_if ^ INTR.if_) & INTR.new_if & IF_STAT) {
        if (!SHOULD_TRIGGER_STAT) {
          INTR.new_if &= ~IF_STAT;
        }
      }
    }
  }
}